

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_mutex_group_context_fail(void)

{
  int iVar1;
  uint uVar2;
  undefined8 in_R9;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  int i;
  test_grp_ctx_t mgroup_ctx1;
  void *user;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&user,0,"program");
  if (iVar1 == 0) {
    mgroup_ctx1.name[0x1c] = '\0';
    mgroup_ctx1.name[0x1d] = '\0';
    mgroup_ctx1.name[0x1e] = '\0';
    mgroup_ctx1.name[0x1f] = '\0';
    mgroup_ctx1.val = 0;
    memset(&local_54,0,0x24);
    local_54 = 0x68;
    local_53 = 0x65;
    local_52 = 0x6c;
    local_51 = 0x6c;
    i._0_1_ = 0x6f;
    mgroup_ctx1.name[0x18] = '\x14';
    mgroup_ctx1.name[0x19] = '\0';
    mgroup_ctx1.name[0x1a] = '\0';
    mgroup_ctx1.name[0x1b] = '\0';
    uVar2 = cargo_add_mutex_group((cargo_t)user,0,"mgroup1",(char *)0x0,(char *)0x0,in_R9,3);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    uVar2 = cargo_set_mutex_group_context((cargo_t)user,"mgroup1",&local_54);
    cargo._4_4_ = uVar2 | cargo._4_4_;
    if (cargo._4_4_ == 0) {
      mgroup_ctx1._28_8_ = cargo_get_mutex_group_context((cargo_t)user,"mgroup2");
      if ((void *)mgroup_ctx1._28_8_ == (void *)0x0) {
        mgroup_ctx1._28_8_ = cargo_get_mutex_group_context((cargo_t)user,"mgroup1");
        if ((undefined1 *)mgroup_ctx1._28_8_ != &local_54) {
          pcStack_18 = "Did not get correct mutex group context";
        }
      }
      else {
        pcStack_18 = "Got non-NULL mutex group context for non-existent group";
      }
    }
    else {
      pcStack_18 = "Failed to add mutex group 1";
    }
    cargo_destroy((cargo_t *)&user);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_mutex_group_context_fail)
{
    void *user = NULL;
    test_grp_ctx_t mgroup_ctx1 = { "hello", 20 };
    int i = 3;
    ret |= cargo_add_mutex_group(cargo, 0, "mgroup1", NULL, NULL);
    ret |= cargo_set_mutex_group_context(cargo, "mgroup1", &mgroup_ctx1);
    cargo_assert(ret == 0, "Failed to add mutex group 1");

    user = cargo_get_mutex_group_context(cargo, "mgroup2");
    cargo_assert(user == NULL, "Got non-NULL mutex group context for non-existent group");

    user = cargo_get_mutex_group_context(cargo, "mgroup1");
    cargo_assert(user == &mgroup_ctx1, "Did not get correct mutex group context");

    _TEST_CLEANUP();
}